

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O1

void get_msurf_descriptor_haar_unroll_4_3_True(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [32];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float *data;
  int c2;
  int iVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  ulong uVar31;
  int c1;
  int iVar32;
  long lVar33;
  int iVar34;
  ulong uVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  uint uVar45;
  int iVar46;
  int iVar47;
  long lVar48;
  float *pfVar49;
  float *pfVar50;
  long lVar51;
  long lVar52;
  float *pfVar53;
  int c1_2;
  int iVar54;
  long lVar55;
  int k_count;
  long lVar56;
  long lVar57;
  long lVar58;
  int iVar59;
  ulong uVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  float fVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar92;
  undefined1 auVar93 [16];
  undefined1 auVar95 [12];
  undefined1 auVar94 [64];
  float fVar96;
  undefined1 auVar97 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [64];
  int data_width;
  
  auVar68._8_4_ = 0x80000000;
  auVar68._0_8_ = 0x8000000080000000;
  auVar68._12_4_ = 0x80000000;
  auVar94 = ZEXT1664(auVar68);
  auVar69._8_4_ = 0x3effffff;
  auVar69._0_8_ = 0x3effffff3effffff;
  auVar69._12_4_ = 0x3effffff;
  auVar97 = ZEXT1664(auVar69);
  fVar76 = ipoint->scale;
  auVar100 = ZEXT464((uint)fVar76);
  auVar61 = vpternlogd_avx512vl(auVar69,ZEXT416((uint)fVar76),auVar68,0xf8);
  auVar61 = ZEXT416((uint)(fVar76 + auVar61._0_4_));
  auVar61 = vroundss_avx(auVar61,auVar61,0xb);
  iVar59 = (int)auVar61._0_4_;
  fVar74 = -0.08 / (fVar76 * fVar76);
  auVar62 = vpternlogd_avx512vl(auVar69,ZEXT416((uint)ipoint->x),auVar68,0xf8);
  auVar62 = ZEXT416((uint)(ipoint->x + auVar62._0_4_));
  auVar62 = vroundss_avx(auVar62,auVar62,0xb);
  auVar63._0_8_ = (double)auVar62._0_4_;
  auVar63._8_8_ = auVar62._8_8_;
  auVar67._0_8_ = (double)fVar76;
  auVar67._8_8_ = 0;
  auVar62 = vfmadd231sd_fma(auVar63,auVar67,ZEXT816(0x3fe0000000000000));
  auVar66._0_4_ = (float)auVar62._0_8_;
  auVar66._4_12_ = auVar62._4_12_;
  auVar62 = vpternlogd_avx512vl(auVar69,ZEXT416((uint)ipoint->y),auVar68,0xf8);
  auVar62 = ZEXT416((uint)(ipoint->y + auVar62._0_4_));
  auVar62 = vroundss_avx(auVar62,auVar62,0xb);
  auVar64._0_8_ = (double)auVar62._0_4_;
  auVar64._8_8_ = auVar62._8_8_;
  auVar62 = vfmadd231sd_fma(auVar64,auVar67,ZEXT816(0x3fe0000000000000));
  auVar65._0_4_ = (float)auVar62._0_8_;
  auVar65._4_12_ = auVar62._4_12_;
  auVar62._0_4_ = (int)auVar61._0_4_;
  auVar62._4_4_ = (int)auVar61._4_4_;
  auVar62._8_4_ = (int)auVar61._8_4_;
  auVar62._12_4_ = (int)auVar61._12_4_;
  auVar61 = vcvtdq2ps_avx(auVar62);
  fVar7 = auVar66._0_4_ - auVar61._0_4_;
  fVar8 = auVar65._0_4_ - auVar61._0_4_;
  auVar61 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar76),auVar66);
  auVar62 = vpternlogd_avx512vl(auVar69,auVar61,auVar68,0xf8);
  auVar61 = ZEXT416((uint)(auVar61._0_4_ + auVar62._0_4_));
  auVar61 = vroundss_avx(auVar61,auVar61,0xb);
  auVar62 = ZEXT416((uint)fVar76);
  if (iVar59 < (int)auVar61._0_4_) {
    auVar61 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar62,auVar65);
    auVar70._8_4_ = 0x3effffff;
    auVar70._0_8_ = 0x3effffff3effffff;
    auVar70._12_4_ = 0x3effffff;
    auVar71._8_4_ = 0x80000000;
    auVar71._0_8_ = 0x8000000080000000;
    auVar71._12_4_ = 0x80000000;
    auVar63 = vpternlogd_avx512vl(auVar71,auVar61,auVar70,0xea);
    auVar61 = ZEXT416((uint)(auVar61._0_4_ + auVar63._0_4_));
    auVar61 = vroundss_avx(auVar61,auVar61,0xb);
    if (iVar59 < (int)auVar61._0_4_) {
      auVar61 = vfmadd231ss_fma(auVar66,auVar62,ZEXT416(0x41300000));
      auVar72._8_4_ = 0x80000000;
      auVar72._0_8_ = 0x8000000080000000;
      auVar72._12_4_ = 0x80000000;
      auVar63 = vpternlogd_avx512vl(auVar72,auVar61,auVar70,0xea);
      auVar61 = ZEXT416((uint)(auVar61._0_4_ + auVar63._0_4_));
      auVar61 = vroundss_avx(auVar61,auVar61,0xb);
      if ((int)auVar61._0_4_ + iVar59 <= iimage->width) {
        auVar61 = vfmadd231ss_fma(auVar65,auVar62,ZEXT416(0x41300000));
        auVar18._8_4_ = 0x80000000;
        auVar18._0_8_ = 0x8000000080000000;
        auVar18._12_4_ = 0x80000000;
        auVar63 = vpternlogd_avx512vl(auVar70,auVar61,auVar18,0xf8);
        auVar61 = ZEXT416((uint)(auVar61._0_4_ + auVar63._0_4_));
        auVar61 = vroundss_avx(auVar61,auVar61,0xb);
        if ((int)auVar61._0_4_ + iVar59 <= iimage->height) {
          fVar7 = fVar7 + 0.5;
          fVar8 = fVar8 + 0.5;
          pfVar49 = iimage->data;
          iVar1 = iimage->data_width;
          iVar34 = iVar59 * 2;
          pfVar53 = haarResponseY + 0x4a;
          pfVar50 = haarResponseX + 0x4a;
          uVar26 = 0xfffffff4;
          do {
            auVar61._0_4_ = (float)(int)uVar26;
            auVar95 = in_ZMM8._4_12_;
            auVar61._4_12_ = auVar95;
            auVar61 = vfmadd213ss_fma(auVar61,auVar62,ZEXT416((uint)fVar8));
            iVar28 = (int)auVar61._0_4_;
            auVar84._0_4_ = (float)(int)(uVar26 | 1);
            auVar84._4_12_ = auVar95;
            auVar61 = vfmadd213ss_fma(auVar84,auVar62,ZEXT416((uint)fVar8));
            iVar29 = (int)auVar61._0_4_;
            auVar85._0_4_ = (float)(int)(uVar26 | 2);
            auVar85._4_12_ = auVar95;
            auVar61 = vfmadd213ss_fma(auVar85,auVar62,ZEXT416((uint)fVar8));
            iVar36 = (int)auVar61._0_4_;
            auVar86._0_4_ = (float)(int)(uVar26 | 3);
            auVar86._4_12_ = auVar95;
            auVar61 = vfmadd213ss_fma(auVar86,auVar62,ZEXT416((uint)fVar8));
            iVar38 = (int)auVar61._0_4_;
            iVar42 = (iVar28 + -1) * iVar1;
            iVar24 = (iVar28 + -1 + iVar59) * iVar1;
            iVar37 = (iVar28 + -1 + iVar34) * iVar1;
            iVar47 = (iVar29 + -1) * iVar1;
            iVar28 = (iVar29 + -1 + iVar59) * iVar1;
            iVar43 = (iVar29 + -1 + iVar34) * iVar1;
            iVar41 = (iVar36 + -1) * iVar1;
            iVar29 = (iVar36 + -1 + iVar59) * iVar1;
            iVar46 = (iVar36 + -1 + iVar34) * iVar1;
            iVar39 = (iVar38 + -1) * iVar1;
            iVar36 = (iVar38 + -1 + iVar59) * iVar1;
            iVar38 = (iVar38 + -1 + iVar34) * iVar1;
            lVar57 = 0;
            do {
              iVar54 = (int)lVar57;
              auVar87._0_4_ = (float)(iVar54 + -0xc);
              auVar95 = auVar97._4_12_;
              auVar87._4_12_ = auVar95;
              auVar61 = vfmadd213ss_fma(auVar87,auVar62,ZEXT416((uint)fVar7));
              iVar44 = (int)auVar61._0_4_;
              auVar88._0_4_ = (float)(iVar54 + -0xb);
              auVar88._4_12_ = auVar95;
              auVar61 = vfmadd213ss_fma(auVar88,auVar62,ZEXT416((uint)fVar7));
              iVar30 = (int)auVar61._0_4_;
              auVar89._0_4_ = (float)(iVar54 + -10);
              auVar89._4_12_ = auVar95;
              auVar61 = vfmadd213ss_fma(auVar89,auVar62,ZEXT416((uint)fVar7));
              iVar32 = iVar44 + -1 + iVar59;
              iVar25 = iVar44 + -1 + iVar34;
              fVar76 = pfVar49[iVar24 + -1 + iVar44];
              fVar75 = pfVar49[iVar37 + -1 + iVar44];
              fVar92 = pfVar49[iVar37 + iVar25];
              fVar9 = pfVar49[iVar42 + -1 + iVar44];
              fVar10 = pfVar49[iVar42 + iVar25];
              auVar64 = SUB6416(ZEXT464(0x40000000),0);
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar49[iVar42 + iVar32] -
                                                      pfVar49[iVar37 + iVar32])),auVar64,
                                        ZEXT416((uint)(fVar92 - fVar9)));
              fVar81 = pfVar49[iVar24 + iVar25];
              pfVar50[lVar57 + -0x4a] = (fVar75 - fVar10) + auVar63._0_4_;
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar76 - fVar81)),auVar64,
                                        ZEXT416((uint)(fVar92 - fVar9)));
              pfVar53[lVar57 + -0x4a] = auVar63._0_4_ - (fVar75 - fVar10);
              fVar76 = pfVar49[iVar28 + -1 + iVar44];
              fVar75 = pfVar49[iVar43 + -1 + iVar44];
              fVar92 = pfVar49[iVar43 + iVar25];
              fVar9 = pfVar49[iVar47 + -1 + iVar44];
              fVar10 = pfVar49[iVar47 + iVar25];
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar49[iVar47 + iVar32] -
                                                      pfVar49[iVar43 + iVar32])),auVar64,
                                        ZEXT416((uint)(fVar92 - fVar9)));
              fVar81 = pfVar49[iVar28 + iVar25];
              pfVar50[lVar57 + -0x32] = (fVar75 - fVar10) + auVar63._0_4_;
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar76 - fVar81)),auVar64,
                                        ZEXT416((uint)(fVar92 - fVar9)));
              pfVar53[lVar57 + -0x32] = auVar63._0_4_ - (fVar75 - fVar10);
              fVar76 = pfVar49[iVar29 + -1 + iVar44];
              fVar75 = pfVar49[iVar46 + -1 + iVar44];
              fVar92 = pfVar49[iVar46 + iVar25];
              fVar9 = pfVar49[iVar41 + -1 + iVar44];
              fVar10 = pfVar49[iVar41 + iVar25];
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar49[iVar41 + iVar32] -
                                                      pfVar49[iVar46 + iVar32])),auVar64,
                                        ZEXT416((uint)(fVar92 - fVar9)));
              fVar81 = pfVar49[iVar29 + iVar25];
              pfVar50[lVar57 + -0x1a] = (fVar75 - fVar10) + auVar63._0_4_;
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar76 - fVar81)),auVar64,
                                        ZEXT416((uint)(fVar92 - fVar9)));
              pfVar53[lVar57 + -0x1a] = auVar63._0_4_ - (fVar75 - fVar10);
              fVar76 = pfVar49[iVar36 + -1 + iVar44];
              fVar75 = pfVar49[iVar38 + -1 + iVar44];
              auVar97 = ZEXT464((uint)pfVar49[iVar25 + iVar38]);
              iVar40 = (int)auVar61._0_4_;
              fVar92 = pfVar49[iVar39 + iVar25];
              auVar63 = ZEXT416((uint)(pfVar49[iVar25 + iVar38] - pfVar49[iVar39 + -1 + iVar44]));
              auVar61 = vfmadd213ss_fma(ZEXT416((uint)(pfVar49[iVar39 + iVar32] -
                                                      pfVar49[iVar32 + iVar38])),auVar64,auVar63);
              fVar9 = pfVar49[iVar36 + iVar25];
              pfVar50[lVar57 + -2] = (fVar75 - fVar92) + auVar61._0_4_;
              auVar61 = vfmadd213ss_fma(ZEXT416((uint)(fVar76 - fVar9)),auVar64,auVar63);
              pfVar53[lVar57 + -2] = auVar61._0_4_ - (fVar75 - fVar92);
              iVar32 = iVar30 + -1 + iVar59;
              iVar25 = iVar30 + -1 + iVar34;
              fVar76 = pfVar49[iVar24 + -1 + iVar30];
              fVar75 = pfVar49[iVar37 + -1 + iVar30];
              fVar92 = pfVar49[iVar37 + iVar25];
              fVar9 = pfVar49[iVar42 + -1 + iVar30];
              fVar10 = pfVar49[iVar42 + iVar25];
              auVar61 = vfmadd213ss_fma(ZEXT416((uint)(pfVar49[iVar42 + iVar32] -
                                                      pfVar49[iVar37 + iVar32])),auVar64,
                                        ZEXT416((uint)(fVar92 - fVar9)));
              fVar81 = pfVar49[iVar24 + iVar25];
              pfVar50[lVar57 + -0x49] = (fVar75 - fVar10) + auVar61._0_4_;
              auVar61 = vfmadd213ss_fma(ZEXT416((uint)(fVar76 - fVar81)),auVar64,
                                        ZEXT416((uint)(fVar92 - fVar9)));
              pfVar53[lVar57 + -0x49] = auVar61._0_4_ - (fVar75 - fVar10);
              fVar76 = pfVar49[iVar28 + -1 + iVar30];
              fVar75 = pfVar49[iVar43 + -1 + iVar30];
              fVar92 = pfVar49[iVar43 + iVar25];
              fVar9 = pfVar49[iVar47 + -1 + iVar30];
              fVar10 = pfVar49[iVar47 + iVar25];
              auVar61 = vfmadd213ss_fma(ZEXT416((uint)(pfVar49[iVar47 + iVar32] -
                                                      pfVar49[iVar43 + iVar32])),auVar64,
                                        ZEXT416((uint)(fVar92 - fVar9)));
              fVar81 = pfVar49[iVar28 + iVar25];
              pfVar50[lVar57 + -0x31] = (fVar75 - fVar10) + auVar61._0_4_;
              auVar61 = vfmadd213ss_fma(ZEXT416((uint)(fVar76 - fVar81)),auVar64,
                                        ZEXT416((uint)(fVar92 - fVar9)));
              pfVar53[lVar57 + -0x31] = auVar61._0_4_ - (fVar75 - fVar10);
              fVar76 = pfVar49[iVar29 + -1 + iVar30];
              fVar75 = pfVar49[iVar46 + -1 + iVar30];
              fVar92 = pfVar49[iVar46 + iVar25];
              fVar9 = pfVar49[iVar41 + -1 + iVar30];
              fVar10 = pfVar49[iVar41 + iVar25];
              auVar61 = vfmadd213ss_fma(ZEXT416((uint)(pfVar49[iVar41 + iVar32] -
                                                      pfVar49[iVar46 + iVar32])),auVar64,
                                        ZEXT416((uint)(fVar92 - fVar9)));
              fVar81 = pfVar49[iVar29 + iVar25];
              pfVar50[lVar57 + -0x19] = (fVar75 - fVar10) + auVar61._0_4_;
              auVar61 = vfmadd213ss_fma(ZEXT416((uint)(fVar76 - fVar81)),auVar64,
                                        ZEXT416((uint)(fVar92 - fVar9)));
              pfVar53[lVar57 + -0x19] = auVar61._0_4_ - (fVar75 - fVar10);
              fVar76 = pfVar49[iVar36 + -1 + iVar30];
              fVar75 = pfVar49[iVar38 + -1 + iVar30];
              fVar92 = pfVar49[iVar25 + iVar38];
              fVar9 = pfVar49[iVar39 + -1 + iVar30];
              fVar10 = pfVar49[iVar39 + iVar25];
              auVar61 = vfmadd213ss_fma(ZEXT416((uint)(pfVar49[iVar39 + iVar32] -
                                                      pfVar49[iVar32 + iVar38])),auVar64,
                                        ZEXT416((uint)(fVar92 - fVar9)));
              fVar81 = pfVar49[iVar36 + iVar25];
              pfVar50[lVar57 + -1] = (fVar75 - fVar10) + auVar61._0_4_;
              auVar61 = vfmadd213ss_fma(ZEXT416((uint)(fVar76 - fVar81)),auVar64,
                                        ZEXT416((uint)(fVar92 - fVar9)));
              pfVar53[lVar57 + -1] = auVar61._0_4_ - (fVar75 - fVar10);
              iVar32 = iVar40 + -1 + iVar59;
              iVar25 = iVar40 + -1 + iVar34;
              fVar76 = pfVar49[iVar24 + -1 + iVar40];
              fVar75 = pfVar49[iVar37 + -1 + iVar40];
              fVar92 = pfVar49[iVar37 + iVar25];
              fVar9 = pfVar49[iVar42 + -1 + iVar40];
              fVar10 = pfVar49[iVar42 + iVar25];
              auVar61 = vfmadd213ss_fma(ZEXT416((uint)(pfVar49[iVar42 + iVar32] -
                                                      pfVar49[iVar37 + iVar32])),auVar64,
                                        ZEXT416((uint)(fVar92 - fVar9)));
              fVar81 = pfVar49[iVar24 + iVar25];
              pfVar50[lVar57 + -0x48] = (fVar75 - fVar10) + auVar61._0_4_;
              auVar61 = vfmadd213ss_fma(ZEXT416((uint)(fVar76 - fVar81)),auVar64,
                                        ZEXT416((uint)(fVar92 - fVar9)));
              pfVar53[lVar57 + -0x48] = auVar61._0_4_ - (fVar75 - fVar10);
              fVar76 = pfVar49[iVar28 + -1 + iVar40];
              fVar75 = pfVar49[iVar43 + -1 + iVar40];
              fVar92 = pfVar49[iVar43 + iVar25];
              fVar9 = pfVar49[iVar47 + -1 + iVar40];
              fVar10 = pfVar49[iVar47 + iVar25];
              auVar61 = vfmadd213ss_fma(ZEXT416((uint)(pfVar49[iVar47 + iVar32] -
                                                      pfVar49[iVar43 + iVar32])),auVar64,
                                        ZEXT416((uint)(fVar92 - fVar9)));
              fVar81 = pfVar49[iVar28 + iVar25];
              pfVar50[lVar57 + -0x30] = (fVar75 - fVar10) + auVar61._0_4_;
              auVar61 = vfmadd213ss_fma(ZEXT416((uint)(fVar76 - fVar81)),auVar64,
                                        ZEXT416((uint)(fVar92 - fVar9)));
              pfVar53[lVar57 + -0x30] = auVar61._0_4_ - (fVar75 - fVar10);
              fVar76 = pfVar49[iVar29 + -1 + iVar40];
              fVar75 = pfVar49[iVar46 + -1 + iVar40];
              fVar92 = pfVar49[iVar46 + iVar25];
              fVar9 = pfVar49[iVar41 + -1 + iVar40];
              fVar10 = pfVar49[iVar41 + iVar25];
              auVar61 = vfmadd213ss_fma(ZEXT416((uint)(pfVar49[iVar41 + iVar32] -
                                                      pfVar49[iVar46 + iVar32])),auVar64,
                                        ZEXT416((uint)(fVar92 - fVar9)));
              fVar81 = pfVar49[iVar29 + iVar25];
              pfVar50[lVar57 + -0x18] = (fVar75 - fVar10) + auVar61._0_4_;
              auVar61 = vfmadd213ss_fma(ZEXT416((uint)(fVar76 - fVar81)),auVar64,
                                        ZEXT416((uint)(fVar92 - fVar9)));
              pfVar53[lVar57 + -0x18] = auVar61._0_4_ - (fVar75 - fVar10);
              fVar76 = pfVar49[iVar36 + -1 + iVar40];
              fVar75 = pfVar49[iVar38 + -1 + iVar40];
              fVar92 = pfVar49[iVar25 + iVar38];
              fVar9 = pfVar49[iVar39 + -1 + iVar40];
              fVar10 = pfVar49[iVar39 + iVar25];
              fVar81 = pfVar49[iVar36 + iVar25];
              auVar61 = vfmadd213ss_fma(ZEXT416((uint)(pfVar49[iVar39 + iVar32] -
                                                      pfVar49[iVar32 + iVar38])),auVar64,
                                        ZEXT416((uint)(fVar92 - fVar9)));
              pfVar50[lVar57] = (fVar75 - fVar10) + auVar61._0_4_;
              auVar61 = vfmadd213ss_fma(ZEXT416((uint)(fVar76 - fVar81)),auVar64,
                                        ZEXT416((uint)(fVar92 - fVar9)));
              pfVar53[lVar57] = auVar61._0_4_ - (fVar75 - fVar10);
              lVar57 = lVar57 + 3;
            } while (iVar54 + -0xc < 9);
            pfVar53 = pfVar53 + 0x60;
            pfVar50 = pfVar50 + 0x60;
            bVar2 = (int)uVar26 < 8;
            uVar26 = uVar26 + 4;
          } while (bVar2);
          goto LAB_0021b90d;
        }
      }
    }
  }
  iVar1 = iVar59 * 2;
  lVar57 = 0;
  uVar26 = 0xfffffff4;
  do {
    auVar61 = vpbroadcastd_avx512vl();
    auVar19._8_4_ = 3;
    auVar19._0_8_ = 0x200000003;
    auVar19._12_4_ = 2;
    auVar61 = vporq_avx512vl(auVar61,auVar19);
    auVar61 = vpinsrd_avx(auVar61,uVar26 | 1,2);
    auVar61 = vpinsrd_avx(auVar61,uVar26,3);
    auVar61 = vcvtdq2ps_avx(auVar61);
    auVar22._4_4_ = fVar8;
    auVar22._0_4_ = fVar8;
    auVar22._8_4_ = fVar8;
    auVar22._12_4_ = fVar8;
    auVar23._4_4_ = fVar76;
    auVar23._0_4_ = fVar76;
    auVar23._8_4_ = fVar76;
    auVar23._12_4_ = fVar76;
    auVar61 = vfmadd132ps_fma(auVar61,auVar22,auVar23);
    auVar6 = vcvtps2pd_avx(auVar61);
    uVar27 = vcmpps_avx512vl(auVar61,_DAT_00576190,0xd);
    auVar79._8_8_ = 0xbfe0000000000000;
    auVar79._0_8_ = 0xbfe0000000000000;
    auVar79._16_8_ = 0xbfe0000000000000;
    auVar79._24_8_ = 0xbfe0000000000000;
    auVar73._12_4_ = 0x3fe00000;
    auVar73._0_12_ = ZEXT812(0x3fe0000000000000);
    auVar73._16_8_ = 0x3fe0000000000000;
    auVar73._24_8_ = 0x3fe0000000000000;
    auVar73 = vblendmpd_avx512vl(auVar79,auVar73);
    bVar2 = (bool)((byte)uVar27 & 1);
    bVar3 = (bool)((byte)(uVar27 >> 1) & 1);
    bVar4 = (bool)((byte)(uVar27 >> 2) & 1);
    bVar5 = (bool)((byte)(uVar27 >> 3) & 1);
    auVar77._0_4_ =
         (int)((double)((ulong)bVar2 * auVar73._0_8_ | (ulong)!bVar2 * -0x4020000000000000) +
              auVar6._0_8_);
    auVar77._4_4_ =
         (int)((double)((ulong)bVar3 * auVar73._8_8_ | (ulong)!bVar3 * -0x4020000000000000) +
              auVar6._8_8_);
    auVar77._8_4_ =
         (int)((double)((ulong)bVar4 * auVar73._16_8_ | (ulong)!bVar4 * -0x4020000000000000) +
              auVar6._16_8_);
    auVar77._12_4_ =
         (int)((double)((ulong)bVar5 * auVar73._24_8_ | (ulong)!bVar5 * -0x4020000000000000) +
              auVar6._24_8_);
    iVar28 = iVar1 + auVar77._12_4_;
    iVar29 = auVar77._12_4_ + -1 + iVar59;
    iVar36 = auVar77._12_4_ + -1;
    iVar37 = iVar1 + auVar77._8_4_;
    iVar38 = auVar77._8_4_ + -1 + iVar59;
    iVar39 = auVar77._8_4_ + -1;
    iVar41 = iVar1 + auVar77._4_4_;
    iVar42 = auVar77._4_4_ + -1 + iVar59;
    auVar20._8_4_ = 1;
    auVar20._0_8_ = 0x100000001;
    auVar20._12_4_ = 1;
    uVar27 = vpcmpd_avx512vl(auVar77,auVar20,1);
    uVar60 = uVar27 & 0xf;
    uVar35 = uVar60 >> 1;
    uVar31 = uVar60 >> 2;
    uVar60 = uVar60 >> 3;
    iVar43 = auVar77._4_4_ + -1;
    iVar46 = iVar1 + auVar77._0_4_;
    iVar47 = auVar77._0_4_ + -1 + iVar59;
    iVar24 = auVar77._0_4_ + -1;
    lVar56 = lVar57;
    iVar34 = -0xc;
    do {
      auVar78._0_4_ = (float)iVar34;
      auVar95 = auVar94._4_12_;
      auVar78._4_12_ = auVar95;
      auVar64 = auVar100._0_16_;
      auVar61 = vfmadd213ss_fma(auVar78,auVar64,ZEXT416((uint)fVar7));
      auVar93._0_4_ = (float)(iVar34 + 1);
      auVar93._4_12_ = auVar95;
      auVar63 = vfmadd213ss_fma(auVar93,auVar64,ZEXT416((uint)fVar7));
      auVar90._0_4_ = (float)(iVar34 + 2);
      auVar90._4_12_ = auVar95;
      auVar64 = vfmadd213ss_fma(auVar90,auVar64,ZEXT416((uint)fVar7));
      fVar75 = auVar61._0_4_;
      iVar54 = (int)((double)((ulong)(0.0 <= fVar75) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar75) * -0x4020000000000000) + (double)fVar75);
      fVar92 = auVar63._0_4_;
      fVar75 = auVar64._0_4_;
      pfVar49 = (float *)((long)haarResponseY + lVar56);
      if (((iVar54 < 1 || uVar60 != 0) || (iimage->height < iVar28)) ||
         (iVar25 = iVar1 + iVar54, iimage->width < iVar25)) {
        auVar94 = ZEXT1664(auVar94._0_16_);
        haarXY(iimage,auVar77._12_4_,iVar54,iVar59,(float *)((long)haarResponseX + lVar56),pfVar49);
      }
      else {
        iVar40 = iVar54 + -1 + iVar59;
        pfVar50 = iimage->data;
        iVar32 = iimage->data_width;
        iVar30 = iVar32 * iVar36;
        fVar9 = pfVar50[iVar32 * iVar29 + -1 + iVar54];
        iVar44 = iVar32 * (iVar1 + -1 + auVar77._12_4_);
        fVar10 = pfVar50[iVar44 + -1 + iVar54];
        fVar81 = pfVar50[iVar44 + -1 + iVar25];
        fVar11 = pfVar50[iVar30 + -1 + iVar54];
        fVar12 = pfVar50[iVar30 + -1 + iVar25];
        fVar13 = pfVar50[iVar32 * iVar29 + -1 + iVar25];
        auVar61 = vfmadd213ss_fma(ZEXT416((uint)(pfVar50[iVar30 + iVar40] - pfVar50[iVar44 + iVar40]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar81 - fVar11)));
        *(float *)((long)haarResponseX + lVar56) = (fVar10 - fVar12) + auVar61._0_4_;
        auVar61 = vfmadd213ss_fma(ZEXT416((uint)(fVar9 - fVar13)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar81 - fVar11)));
        *pfVar49 = auVar61._0_4_ - (fVar10 - fVar12);
      }
      pfVar49 = (float *)((long)haarResponseX + lVar56 + 0x60);
      pfVar50 = (float *)((long)haarResponseY + lVar56 + 0x60);
      if (((iVar54 < 1 || (uVar31 & 1) != 0) || (iimage->height < iVar37)) ||
         (iVar25 = iVar1 + iVar54, iimage->width < iVar25)) {
        auVar94 = ZEXT1664(auVar94._0_16_);
        haarXY(iimage,auVar77._8_4_,iVar54,iVar59,pfVar49,pfVar50);
      }
      else {
        iVar40 = iVar54 + -1 + iVar59;
        pfVar53 = iimage->data;
        iVar32 = iimage->data_width;
        iVar30 = iVar32 * iVar39;
        fVar9 = pfVar53[iVar32 * iVar38 + -1 + iVar54];
        iVar44 = iVar32 * (iVar1 + -1 + auVar77._8_4_);
        fVar10 = pfVar53[iVar44 + -1 + iVar54];
        fVar81 = pfVar53[iVar44 + -1 + iVar25];
        fVar11 = pfVar53[iVar30 + -1 + iVar54];
        fVar12 = pfVar53[iVar30 + -1 + iVar25];
        fVar13 = pfVar53[iVar32 * iVar38 + -1 + iVar25];
        auVar61 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar30 + iVar40] - pfVar53[iVar44 + iVar40]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar81 - fVar11)));
        *pfVar49 = (fVar10 - fVar12) + auVar61._0_4_;
        auVar61 = vfmadd213ss_fma(ZEXT416((uint)(fVar9 - fVar13)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar81 - fVar11)));
        *pfVar50 = auVar61._0_4_ - (fVar10 - fVar12);
      }
      pfVar49 = (float *)((long)haarResponseX + lVar56 + 0xc0);
      pfVar50 = (float *)((long)haarResponseY + lVar56 + 0xc0);
      if (((iVar54 < 1 || (uVar35 & 1) != 0) || (iimage->height < iVar41)) ||
         (iVar25 = iVar1 + iVar54, iimage->width < iVar25)) {
        auVar94 = ZEXT1664(auVar94._0_16_);
        haarXY(iimage,auVar77._4_4_,iVar54,iVar59,pfVar49,pfVar50);
      }
      else {
        iVar40 = iVar54 + -1 + iVar59;
        pfVar53 = iimage->data;
        iVar32 = iimage->data_width;
        iVar30 = iVar32 * iVar43;
        fVar9 = pfVar53[iVar32 * iVar42 + -1 + iVar54];
        iVar44 = iVar32 * (iVar1 + -1 + auVar77._4_4_);
        fVar10 = pfVar53[iVar44 + -1 + iVar54];
        fVar81 = pfVar53[iVar44 + -1 + iVar25];
        fVar11 = pfVar53[iVar30 + -1 + iVar54];
        fVar12 = pfVar53[iVar30 + -1 + iVar25];
        fVar13 = pfVar53[iVar32 * iVar42 + -1 + iVar25];
        auVar61 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar30 + iVar40] - pfVar53[iVar44 + iVar40]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar81 - fVar11)));
        *pfVar49 = (fVar10 - fVar12) + auVar61._0_4_;
        auVar61 = vfmadd213ss_fma(ZEXT416((uint)(fVar9 - fVar13)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar81 - fVar11)));
        *pfVar50 = auVar61._0_4_ - (fVar10 - fVar12);
      }
      pfVar49 = (float *)((long)haarResponseX + lVar56 + 0x120);
      pfVar50 = (float *)((long)haarResponseY + lVar56 + 0x120);
      if (((iVar54 < 1 || (uVar27 & 1) != 0) || (iimage->height < iVar46)) ||
         (iVar25 = iVar1 + iVar54, iimage->width < iVar25)) {
        auVar94 = ZEXT1664(auVar94._0_16_);
        haarXY(iimage,auVar77._0_4_,iVar54,iVar59,pfVar49,pfVar50);
      }
      else {
        iVar30 = iVar54 + -1 + iVar59;
        pfVar53 = iimage->data;
        iVar32 = iimage->data_width;
        iVar44 = iVar32 * iVar24;
        fVar9 = pfVar53[iVar32 * iVar47 + -1 + iVar54];
        iVar40 = iVar32 * (iVar1 + -1 + auVar77._0_4_);
        fVar10 = pfVar53[iVar40 + -1 + iVar54];
        fVar81 = pfVar53[iVar40 + -1 + iVar25];
        fVar11 = pfVar53[iVar44 + -1 + iVar54];
        fVar12 = pfVar53[iVar44 + -1 + iVar25];
        fVar13 = pfVar53[iVar32 * iVar47 + -1 + iVar25];
        auVar61 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar44 + iVar30] - pfVar53[iVar40 + iVar30]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar81 - fVar11)));
        *pfVar49 = (fVar10 - fVar12) + auVar61._0_4_;
        auVar61 = vfmadd213ss_fma(ZEXT416((uint)(fVar9 - fVar13)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar81 - fVar11)));
        *pfVar50 = auVar61._0_4_ - (fVar10 - fVar12);
      }
      iVar54 = (int)((double)((ulong)(0.0 <= fVar92) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar92) * -0x4020000000000000) + (double)fVar92);
      pfVar49 = (float *)((long)haarResponseX + lVar56 + 4);
      pfVar50 = (float *)((long)haarResponseY + lVar56 + 4);
      if (((iVar54 < 1 || uVar60 != 0) || (iimage->height < iVar28)) ||
         (iVar25 = iVar1 + iVar54, iimage->width < iVar25)) {
        auVar94 = ZEXT1664(auVar94._0_16_);
        haarXY(iimage,auVar77._12_4_,iVar54,iVar59,pfVar49,pfVar50);
      }
      else {
        iVar40 = iVar54 + -1 + iVar59;
        pfVar53 = iimage->data;
        iVar32 = iimage->data_width;
        iVar30 = iVar32 * iVar36;
        fVar92 = pfVar53[iVar32 * iVar29 + -1 + iVar54];
        iVar44 = iVar32 * (iVar1 + -1 + auVar77._12_4_);
        fVar9 = pfVar53[iVar44 + -1 + iVar54];
        fVar10 = pfVar53[iVar44 + -1 + iVar25];
        fVar81 = pfVar53[iVar30 + -1 + iVar54];
        fVar11 = pfVar53[iVar30 + -1 + iVar25];
        fVar12 = pfVar53[iVar32 * iVar29 + -1 + iVar25];
        auVar61 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar30 + iVar40] - pfVar53[iVar44 + iVar40]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar81)));
        *pfVar49 = (fVar9 - fVar11) + auVar61._0_4_;
        auVar61 = vfmadd213ss_fma(ZEXT416((uint)(fVar92 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar81)));
        *pfVar50 = auVar61._0_4_ - (fVar9 - fVar11);
      }
      pfVar49 = (float *)((long)haarResponseX + lVar56 + 100);
      pfVar50 = (float *)((long)haarResponseY + lVar56 + 100);
      if (((iVar54 < 1 || (uVar31 & 1) != 0) || (iimage->height < iVar37)) ||
         (iVar25 = iVar1 + iVar54, iimage->width < iVar25)) {
        auVar94 = ZEXT1664(auVar94._0_16_);
        haarXY(iimage,auVar77._8_4_,iVar54,iVar59,pfVar49,pfVar50);
      }
      else {
        iVar40 = iVar54 + -1 + iVar59;
        pfVar53 = iimage->data;
        iVar32 = iimage->data_width;
        iVar30 = iVar32 * iVar39;
        fVar92 = pfVar53[iVar32 * iVar38 + -1 + iVar54];
        iVar44 = iVar32 * (iVar1 + -1 + auVar77._8_4_);
        fVar9 = pfVar53[iVar44 + -1 + iVar54];
        fVar10 = pfVar53[iVar44 + -1 + iVar25];
        fVar81 = pfVar53[iVar30 + -1 + iVar54];
        fVar11 = pfVar53[iVar30 + -1 + iVar25];
        fVar12 = pfVar53[iVar32 * iVar38 + -1 + iVar25];
        auVar61 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar30 + iVar40] - pfVar53[iVar44 + iVar40]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar81)));
        *pfVar49 = (fVar9 - fVar11) + auVar61._0_4_;
        auVar61 = vfmadd213ss_fma(ZEXT416((uint)(fVar92 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar81)));
        *pfVar50 = auVar61._0_4_ - (fVar9 - fVar11);
      }
      pfVar49 = (float *)((long)haarResponseX + lVar56 + 0xc4);
      pfVar50 = (float *)((long)haarResponseY + lVar56 + 0xc4);
      if (((iVar54 < 1 || (uVar35 & 1) != 0) || (iimage->height < iVar41)) ||
         (iVar25 = iVar1 + iVar54, iimage->width < iVar25)) {
        auVar94 = ZEXT1664(auVar94._0_16_);
        haarXY(iimage,auVar77._4_4_,iVar54,iVar59,pfVar49,pfVar50);
      }
      else {
        iVar40 = iVar54 + -1 + iVar59;
        pfVar53 = iimage->data;
        iVar32 = iimage->data_width;
        iVar30 = iVar32 * iVar43;
        fVar92 = pfVar53[iVar32 * iVar42 + -1 + iVar54];
        iVar44 = iVar32 * (iVar1 + -1 + auVar77._4_4_);
        fVar9 = pfVar53[iVar44 + -1 + iVar54];
        fVar10 = pfVar53[iVar44 + -1 + iVar25];
        fVar81 = pfVar53[iVar30 + -1 + iVar54];
        fVar11 = pfVar53[iVar30 + -1 + iVar25];
        fVar12 = pfVar53[iVar32 * iVar42 + -1 + iVar25];
        auVar61 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar30 + iVar40] - pfVar53[iVar44 + iVar40]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar81)));
        *pfVar49 = (fVar9 - fVar11) + auVar61._0_4_;
        auVar61 = vfmadd213ss_fma(ZEXT416((uint)(fVar92 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar81)));
        *pfVar50 = auVar61._0_4_ - (fVar9 - fVar11);
      }
      pfVar49 = (float *)((long)haarResponseX + lVar56 + 0x124);
      pfVar50 = (float *)((long)haarResponseY + lVar56 + 0x124);
      if (((iVar54 < 1 || (uVar27 & 1) != 0) || (iimage->height < iVar46)) ||
         (iVar25 = iVar1 + iVar54, iimage->width < iVar25)) {
        auVar94 = ZEXT1664(auVar94._0_16_);
        haarXY(iimage,auVar77._0_4_,iVar54,iVar59,pfVar49,pfVar50);
      }
      else {
        iVar30 = iVar54 + -1 + iVar59;
        pfVar53 = iimage->data;
        iVar32 = iimage->data_width;
        iVar44 = iVar32 * iVar24;
        fVar92 = pfVar53[iVar32 * iVar47 + -1 + iVar54];
        iVar40 = iVar32 * (iVar1 + -1 + auVar77._0_4_);
        fVar9 = pfVar53[iVar40 + -1 + iVar54];
        fVar10 = pfVar53[iVar40 + -1 + iVar25];
        fVar81 = pfVar53[iVar44 + -1 + iVar54];
        fVar11 = pfVar53[iVar44 + -1 + iVar25];
        fVar12 = pfVar53[iVar32 * iVar47 + -1 + iVar25];
        auVar61 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar44 + iVar30] - pfVar53[iVar40 + iVar30]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar81)));
        *pfVar49 = (fVar9 - fVar11) + auVar61._0_4_;
        auVar61 = vfmadd213ss_fma(ZEXT416((uint)(fVar92 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar81)));
        *pfVar50 = auVar61._0_4_ - (fVar9 - fVar11);
      }
      iVar54 = (int)((double)((ulong)(0.0 <= fVar75) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar75) * -0x4020000000000000) + (double)fVar75);
      pfVar49 = (float *)((long)haarResponseX + lVar56 + 8);
      pfVar50 = (float *)((long)haarResponseY + lVar56 + 8);
      if (((iVar54 < 1 || uVar60 != 0) || (iimage->height < iVar28)) ||
         (iVar25 = iVar1 + iVar54, iimage->width < iVar25)) {
        auVar94 = ZEXT1664(auVar94._0_16_);
        haarXY(iimage,auVar77._12_4_,iVar54,iVar59,pfVar49,pfVar50);
      }
      else {
        iVar40 = iVar54 + -1 + iVar59;
        pfVar53 = iimage->data;
        iVar32 = iimage->data_width;
        iVar30 = iVar32 * iVar36;
        fVar75 = pfVar53[iVar32 * iVar29 + -1 + iVar54];
        iVar44 = iVar32 * (iVar1 + -1 + auVar77._12_4_);
        fVar92 = pfVar53[iVar44 + -1 + iVar54];
        fVar9 = pfVar53[iVar44 + -1 + iVar25];
        fVar10 = pfVar53[iVar30 + -1 + iVar54];
        fVar81 = pfVar53[iVar30 + -1 + iVar25];
        fVar11 = pfVar53[iVar32 * iVar29 + -1 + iVar25];
        auVar61 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar30 + iVar40] - pfVar53[iVar44 + iVar40]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar49 = (fVar92 - fVar81) + auVar61._0_4_;
        auVar61 = vfmadd213ss_fma(ZEXT416((uint)(fVar75 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar50 = auVar61._0_4_ - (fVar92 - fVar81);
      }
      pfVar49 = (float *)((long)haarResponseX + lVar56 + 0x68);
      pfVar50 = (float *)((long)haarResponseY + lVar56 + 0x68);
      if (((iVar54 < 1 || (uVar31 & 1) != 0) || (iimage->height < iVar37)) ||
         (iVar25 = iVar1 + iVar54, iimage->width < iVar25)) {
        auVar94 = ZEXT1664(auVar94._0_16_);
        haarXY(iimage,auVar77._8_4_,iVar54,iVar59,pfVar49,pfVar50);
      }
      else {
        iVar40 = iVar54 + -1 + iVar59;
        pfVar53 = iimage->data;
        iVar32 = iimage->data_width;
        iVar30 = iVar32 * iVar39;
        fVar75 = pfVar53[iVar32 * iVar38 + -1 + iVar54];
        iVar44 = iVar32 * (iVar1 + -1 + auVar77._8_4_);
        fVar92 = pfVar53[iVar44 + -1 + iVar54];
        fVar9 = pfVar53[iVar44 + -1 + iVar25];
        fVar10 = pfVar53[iVar30 + -1 + iVar54];
        fVar81 = pfVar53[iVar30 + -1 + iVar25];
        fVar11 = pfVar53[iVar32 * iVar38 + -1 + iVar25];
        auVar61 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar30 + iVar40] - pfVar53[iVar44 + iVar40]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar49 = (fVar92 - fVar81) + auVar61._0_4_;
        auVar61 = vfmadd213ss_fma(ZEXT416((uint)(fVar75 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar50 = auVar61._0_4_ - (fVar92 - fVar81);
      }
      pfVar49 = (float *)((long)haarResponseX + lVar56 + 200);
      pfVar50 = (float *)((long)haarResponseY + lVar56 + 200);
      if (((iVar54 < 1 || (uVar35 & 1) != 0) || (iimage->height < iVar41)) ||
         (iVar25 = iVar1 + iVar54, iimage->width < iVar25)) {
        auVar94 = ZEXT1664(auVar94._0_16_);
        haarXY(iimage,auVar77._4_4_,iVar54,iVar59,pfVar49,pfVar50);
      }
      else {
        iVar40 = iVar54 + -1 + iVar59;
        pfVar53 = iimage->data;
        iVar32 = iimage->data_width;
        iVar30 = iVar32 * iVar43;
        fVar75 = pfVar53[iVar32 * iVar42 + -1 + iVar54];
        iVar44 = iVar32 * (iVar1 + -1 + auVar77._4_4_);
        fVar92 = pfVar53[iVar44 + -1 + iVar54];
        fVar9 = pfVar53[iVar44 + -1 + iVar25];
        fVar10 = pfVar53[iVar30 + -1 + iVar54];
        fVar81 = pfVar53[iVar30 + -1 + iVar25];
        fVar11 = pfVar53[iVar32 * iVar42 + -1 + iVar25];
        auVar61 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar30 + iVar40] - pfVar53[iVar44 + iVar40]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar49 = (fVar92 - fVar81) + auVar61._0_4_;
        auVar61 = vfmadd213ss_fma(ZEXT416((uint)(fVar75 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar50 = auVar61._0_4_ - (fVar92 - fVar81);
      }
      pfVar49 = (float *)((long)haarResponseX + lVar56 + 0x128);
      pfVar50 = (float *)((long)haarResponseY + lVar56 + 0x128);
      if (((iVar54 < 1 || (uVar27 & 1) != 0) || (iimage->height < iVar46)) ||
         (iVar25 = iVar1 + iVar54, iimage->width < iVar25)) {
        auVar94 = ZEXT1664(auVar94._0_16_);
        haarXY(iimage,auVar77._0_4_,iVar54,iVar59,pfVar49,pfVar50);
      }
      else {
        iVar30 = iVar54 + -1 + iVar59;
        pfVar53 = iimage->data;
        iVar32 = iimage->data_width;
        iVar44 = iVar32 * iVar24;
        fVar75 = pfVar53[iVar32 * iVar47 + -1 + iVar54];
        iVar40 = iVar32 * (iVar1 + -1 + auVar77._0_4_);
        fVar92 = pfVar53[iVar40 + -1 + iVar54];
        fVar9 = pfVar53[iVar40 + -1 + iVar25];
        fVar10 = pfVar53[iVar44 + -1 + iVar54];
        fVar81 = pfVar53[iVar44 + -1 + iVar25];
        fVar11 = pfVar53[iVar32 * iVar47 + -1 + iVar25];
        auVar61 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar44 + iVar30] - pfVar53[iVar40 + iVar30]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar49 = (fVar92 - fVar81) + auVar61._0_4_;
        auVar61 = vfmadd213ss_fma(ZEXT416((uint)(fVar75 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar50 = auVar61._0_4_ - (fVar92 - fVar81);
      }
      auVar100 = ZEXT1664(auVar62);
      lVar56 = lVar56 + 0xc;
      bVar2 = iVar34 < 9;
      iVar34 = iVar34 + 3;
    } while (bVar2);
    lVar57 = lVar57 + 0x180;
    bVar2 = (int)uVar26 < 8;
    uVar26 = uVar26 + 4;
  } while (bVar2);
LAB_0021b90d:
  fVar76 = auVar100._0_4_;
  auVar99._8_4_ = 0x3effffff;
  auVar99._0_8_ = 0x3effffff3effffff;
  auVar99._12_4_ = 0x3effffff;
  auVar98._8_4_ = 0x80000000;
  auVar98._0_8_ = 0x8000000080000000;
  auVar98._12_4_ = 0x80000000;
  auVar61 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar76 * 0.5)),auVar98,0xf8);
  auVar61 = ZEXT416((uint)(fVar76 * 0.5 + auVar61._0_4_));
  auVar61 = vroundss_avx(auVar61,auVar61,0xb);
  auVar62 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar76 * 1.5)),auVar98,0xf8);
  auVar62 = ZEXT416((uint)(fVar76 * 1.5 + auVar62._0_4_));
  auVar62 = vroundss_avx(auVar62,auVar62,0xb);
  auVar63 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar76 * 2.5)),auVar98,0xf8);
  auVar63 = ZEXT416((uint)(fVar76 * 2.5 + auVar63._0_4_));
  auVar63 = vroundss_avx(auVar63,auVar63,0xb);
  auVar64 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar76 * 3.5)),auVar98,0xf8);
  auVar64 = ZEXT416((uint)(fVar76 * 3.5 + auVar64._0_4_));
  auVar64 = vroundss_avx(auVar64,auVar64,0xb);
  auVar65 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar76 * 4.5)),auVar98,0xf8);
  auVar65 = ZEXT416((uint)(fVar76 * 4.5 + auVar65._0_4_));
  auVar65 = vroundss_avx(auVar65,auVar65,0xb);
  auVar66 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar76 * 5.5)),auVar98,0xf8);
  auVar66 = ZEXT416((uint)(fVar76 * 5.5 + auVar66._0_4_));
  auVar66 = vroundss_avx(auVar66,auVar66,0xb);
  auVar67 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar76 * 6.5)),auVar98,0xf8);
  auVar67 = ZEXT416((uint)(fVar76 * 6.5 + auVar67._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  auVar68 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar76 * 7.5)),auVar98,0xf8);
  auVar68 = ZEXT416((uint)(auVar68._0_4_ + fVar76 * 7.5));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar69 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar76 * 8.5)),auVar98,0xf8);
  auVar69 = ZEXT416((uint)(fVar76 * 8.5 + auVar69._0_4_));
  auVar69 = vroundss_avx(auVar69,auVar69,0xb);
  auVar70 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar76 * 9.5)),auVar98,0xf8);
  auVar70 = ZEXT416((uint)(fVar76 * 9.5 + auVar70._0_4_));
  auVar70 = vroundss_avx(auVar70,auVar70,0xb);
  auVar71 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar76 * 10.5)),auVar98,0xf8);
  auVar71 = ZEXT416((uint)(fVar76 * 10.5 + auVar71._0_4_));
  auVar71 = vroundss_avx(auVar71,auVar71,0xb);
  auVar72 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar76 * 11.5)),auVar98,0xf8);
  auVar72 = ZEXT416((uint)(fVar76 * 11.5 + auVar72._0_4_));
  auVar72 = vroundss_avx(auVar72,auVar72,0xb);
  fVar81 = auVar63._0_4_;
  fVar76 = fVar81 + auVar62._0_4_;
  fVar7 = fVar81 + auVar61._0_4_;
  fVar8 = fVar81 - auVar61._0_4_;
  fVar75 = fVar81 - auVar62._0_4_;
  fVar92 = fVar81 - auVar64._0_4_;
  fVar9 = fVar81 - auVar65._0_4_;
  fVar10 = fVar81 - auVar66._0_4_;
  fVar81 = fVar81 - auVar67._0_4_;
  fVar96 = auVar68._0_4_;
  fVar11 = fVar96 - auVar64._0_4_;
  fVar12 = fVar96 - auVar65._0_4_;
  fVar13 = fVar96 - auVar66._0_4_;
  fVar14 = fVar96 - auVar67._0_4_;
  fVar15 = fVar96 - auVar69._0_4_;
  fVar16 = fVar96 - auVar70._0_4_;
  fVar17 = fVar96 - auVar71._0_4_;
  fVar96 = fVar96 - auVar72._0_4_;
  gauss_s1_c0[0] = expf(fVar76 * fVar76 * fVar74);
  gauss_s1_c0[1] = expf(fVar7 * fVar7 * fVar74);
  gauss_s1_c0[2] = expf(fVar8 * fVar8 * fVar74);
  gauss_s1_c0[3] = expf(fVar75 * fVar75 * fVar74);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar92 * fVar92 * fVar74);
  gauss_s1_c0[6] = expf(fVar9 * fVar9 * fVar74);
  gauss_s1_c0[7] = expf(fVar10 * fVar10 * fVar74);
  gauss_s1_c0[8] = expf(fVar81 * fVar81 * fVar74);
  gauss_s1_c1[0] = expf(fVar11 * fVar11 * fVar74);
  gauss_s1_c1[1] = expf(fVar12 * fVar12 * fVar74);
  gauss_s1_c1[2] = expf(fVar13 * fVar13 * fVar74);
  gauss_s1_c1[3] = expf(fVar14 * fVar14 * fVar74);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar15 * fVar15 * fVar74);
  gauss_s1_c1[6] = expf(fVar16 * fVar16 * fVar74);
  gauss_s1_c1[7] = expf(fVar17 * fVar17 * fVar74);
  gauss_s1_c1[8] = expf(fVar96 * fVar96 * fVar74);
  uVar27 = 0xfffffff8;
  lVar57 = 0;
  fVar76 = 0.0;
  auVar80._8_4_ = 0x7fffffff;
  auVar80._0_8_ = 0x7fffffff7fffffff;
  auVar80._12_4_ = 0x7fffffff;
  lVar56 = 0;
  lVar51 = 0;
  do {
    pfVar49 = gauss_s1_c1;
    uVar26 = (uint)uVar27;
    if (uVar26 != 7) {
      pfVar49 = gauss_s1_c0;
    }
    if (uVar26 == 0xfffffff8) {
      pfVar49 = gauss_s1_c1;
    }
    lVar56 = (long)(int)lVar56;
    iVar59 = (int)lVar51;
    lVar51 = (long)iVar59;
    lVar48 = (long)haarResponseX + lVar57;
    lVar33 = (long)haarResponseY + lVar57;
    uVar45 = 0xfffffff8;
    uVar35 = 0;
    do {
      pfVar50 = gauss_s1_c1;
      if (uVar45 != 7) {
        pfVar50 = gauss_s1_c0;
      }
      if (uVar45 == 0xfffffff8) {
        pfVar50 = gauss_s1_c1;
      }
      uVar60 = (ulong)(uVar45 >> 0x1c & 0xfffffff8);
      auVar94 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar31 = uVar35;
      lVar55 = lVar48;
      lVar58 = lVar33;
      do {
        lVar52 = 0;
        pfVar53 = (float *)((long)pfVar49 + (ulong)(uint)((int)(uVar27 >> 0x1f) << 5));
        do {
          fVar7 = pfVar50[uVar60] * *pfVar53;
          auVar61 = vinsertps_avx(ZEXT416(*(uint *)(lVar58 + lVar52 * 4)),
                                  ZEXT416(*(uint *)(lVar55 + lVar52 * 4)),0x10);
          auVar91._0_4_ = fVar7 * auVar61._0_4_;
          auVar91._4_4_ = fVar7 * auVar61._4_4_;
          auVar91._8_4_ = fVar7 * auVar61._8_4_;
          auVar91._12_4_ = fVar7 * auVar61._12_4_;
          auVar61 = vandps_avx(auVar91,auVar80);
          auVar61 = vmovlhps_avx(auVar91,auVar61);
          auVar82._0_4_ = auVar94._0_4_ + auVar61._0_4_;
          auVar82._4_4_ = auVar94._4_4_ + auVar61._4_4_;
          auVar82._8_4_ = auVar94._8_4_ + auVar61._8_4_;
          auVar82._12_4_ = auVar94._12_4_ + auVar61._12_4_;
          auVar94 = ZEXT1664(auVar82);
          pfVar53 = pfVar53 + (ulong)(~uVar26 >> 0x1f) * 2 + -1;
          lVar52 = lVar52 + 1;
        } while (lVar52 != 9);
        uVar31 = uVar31 + 0x18;
        uVar60 = uVar60 + (ulong)(-1 < (int)uVar45) * 2 + -1;
        lVar55 = lVar55 + 0x60;
        lVar58 = lVar58 + 0x60;
      } while (uVar31 < uVar45 * 0x18 + 0x198);
      fVar7 = gauss_s2_arr[lVar51];
      auVar21._4_4_ = fVar7;
      auVar21._0_4_ = fVar7;
      auVar21._8_4_ = fVar7;
      auVar21._12_4_ = fVar7;
      auVar63 = vmulps_avx512vl(auVar82,auVar21);
      lVar51 = lVar51 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar56) = auVar63;
      auVar83._0_4_ = auVar63._0_4_ * auVar63._0_4_;
      auVar83._4_4_ = auVar63._4_4_ * auVar63._4_4_;
      auVar83._8_4_ = auVar63._8_4_ * auVar63._8_4_;
      auVar83._12_4_ = auVar63._12_4_ * auVar63._12_4_;
      auVar61 = vmovshdup_avx(auVar83);
      auVar62 = vfmadd231ss_fma(auVar61,auVar63,auVar63);
      auVar61 = vshufpd_avx(auVar63,auVar63,1);
      auVar62 = vfmadd213ss_fma(auVar61,auVar61,auVar62);
      auVar61 = vshufps_avx(auVar63,auVar63,0xff);
      auVar61 = vfmadd213ss_fma(auVar61,auVar61,auVar62);
      fVar76 = fVar76 + auVar61._0_4_;
      lVar56 = lVar56 + 4;
      uVar45 = uVar45 + 5;
      uVar35 = uVar35 + 0x78;
      lVar48 = lVar48 + 0x1e0;
      lVar33 = lVar33 + 0x1e0;
    } while (iVar59 + 4 != (int)lVar51);
    lVar57 = lVar57 + 0x14;
    uVar27 = (ulong)(uVar26 + 5);
  } while ((int)uVar26 < 3);
  if (fVar76 < 0.0) {
    fVar76 = sqrtf(fVar76);
  }
  else {
    auVar61 = vsqrtss_avx(ZEXT416((uint)fVar76),ZEXT416((uint)fVar76));
    fVar76 = auVar61._0_4_;
  }
  auVar94 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar76)));
  lVar57 = 0;
  do {
    auVar97 = vmulps_avx512f(auVar94,*(undefined1 (*) [64])(ipoint->descriptor + lVar57));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar57) = auVar97;
    lVar57 = lVar57 + 0x10;
  } while (lVar57 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_4_3_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            float ipoint_y_sub_int_scale_add_l2_mul_scale = ipoint_y_sub_int_scale + l2 * scale;
            float ipoint_y_sub_int_scale_add_l3_mul_scale = ipoint_y_sub_int_scale + l3 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_l2_mul_scale + (ipoint_y_sub_int_scale_add_l2_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_l3_mul_scale + (ipoint_y_sub_int_scale_add_l3_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_05 + l2 * scale);
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_05 + l3 * scale);

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}